

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TDeletingArray<F3DFloor_*,_F3DFloor_*>::~TDeletingArray
          (TDeletingArray<F3DFloor_*,_F3DFloor_*> *this)

{
  F3DFloor *pFVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (this->super_TArray<F3DFloor_*,_F3DFloor_*>).Count; uVar2 = uVar2 + 1) {
    pFVar1 = (this->super_TArray<F3DFloor_*,_F3DFloor_*>).Array[uVar2];
    if (pFVar1 != (F3DFloor *)0x0) {
      operator_delete(pFVar1,0x98);
    }
  }
  TArray<F3DFloor_*,_F3DFloor_*>::~TArray(&this->super_TArray<F3DFloor_*,_F3DFloor_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}